

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O0

void lm_trie_build(lm_trie_t *trie,ngram_raw_t **raw_ngrams,uint32 *counts,uint32 *out_counts,
                  int order)

{
  middle_t *next_middle_ptr;
  middle_t *middle_ptr;
  int i;
  int order_local;
  uint32 *out_counts_local;
  uint32 *counts_local;
  ngram_raw_t **raw_ngrams_local;
  lm_trie_t *trie_local;
  
  lm_trie_fix_counts(raw_ngrams,counts,out_counts,order);
  lm_trie_alloc_ngram(trie,out_counts,order);
  if (1 < order) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
            ,0x20a,"Training quantizer\n");
  }
  for (middle_ptr._0_4_ = 2; (int)middle_ptr < order; middle_ptr._0_4_ = (int)middle_ptr + 1) {
    lm_trie_quant_train(trie->quant,(int)middle_ptr,counts[(int)middle_ptr + -1],
                        raw_ngrams[(int)middle_ptr + -2]);
  }
  lm_trie_quant_train_prob(trie->quant,order,counts[order + -1],raw_ngrams[order + -2]);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
          ,0x212,"Building LM trie\n");
  recursive_insert(trie,raw_ngrams,counts,order);
  if (trie->middle_begin != trie->middle_end) {
    for (next_middle_ptr = trie->middle_begin; next_middle_ptr != trie->middle_end + -1;
        next_middle_ptr = next_middle_ptr + 1) {
      middle_finish_loading(next_middle_ptr,next_middle_ptr[1].base.insert_index);
    }
    middle_finish_loading(trie->middle_end + -1,(trie->longest->base).insert_index);
  }
  return;
}

Assistant:

void
lm_trie_build(lm_trie_t * trie, ngram_raw_t ** raw_ngrams, uint32 * counts, uint32 *out_counts,
              int order)
{
    int i;

    lm_trie_fix_counts(raw_ngrams, counts, out_counts, order);
    lm_trie_alloc_ngram(trie, out_counts, order);
    
    if (order > 1)
        E_INFO("Training quantizer\n");
    for (i = 2; i < order; i++) {
        lm_trie_quant_train(trie->quant, i, counts[i - 1],
                            raw_ngrams[i - 2]);
    }
    lm_trie_quant_train_prob(trie->quant, order, counts[order - 1],
                             raw_ngrams[order - 2]);

    E_INFO("Building LM trie\n");
    recursive_insert(trie, raw_ngrams, counts, order);
    /* Set ending offsets so the last entry will be sized properly */
    /* Last entry for unigrams was already set. */
    if (trie->middle_begin != trie->middle_end) {
        middle_t *middle_ptr;
        for (middle_ptr = trie->middle_begin;
             middle_ptr != trie->middle_end - 1; ++middle_ptr) {
            middle_t *next_middle_ptr = middle_ptr + 1;
            middle_finish_loading(middle_ptr,
                                  next_middle_ptr->base.insert_index);
        }
        middle_ptr = trie->middle_end - 1;
        middle_finish_loading(middle_ptr,
                              trie->longest->base.insert_index);
    }
}